

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

void __thiscall
aeron::archive::AeronArchive::truncateRecording
          (AeronArchive *this,int64_t recordingId,int64_t position)

{
  _Any_data local_50;
  code *local_40;
  code *local_38;
  int64_t local_30;
  int64_t local_28;
  
  local_50._8_8_ = 0;
  local_30 = position;
  local_28 = recordingId;
  local_50._M_unused._M_object = operator_new(0x18);
  *(AeronArchive **)local_50._M_unused._0_8_ = this;
  *(int64_t **)((long)local_50._M_unused._0_8_ + 8) = &local_28;
  *(int64_t **)((long)local_50._M_unused._0_8_ + 0x10) = &local_30;
  local_38 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:284:9)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:284:9)>
             ::_M_manager;
  callAndPollForResponse(this,(function<bool_(long)> *)&local_50,"truncate recording");
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void AeronArchive::truncateRecording(std::int64_t recordingId, std::int64_t position) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->truncateRecording(recordingId, position, correlationId, controlSessionId_);
        },
        "truncate recording");
}